

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O2

void * INT_CMCondition_get_client_data(CManager cm,int condition)

{
  CMControlList cl;
  CMCondition p_Var1;
  void *pvVar2;
  
  cl = cm->control_list;
  set_debug_flag(cm);
  p_Var1 = CMCondition_find(cl,condition);
  if (p_Var1 == (CMCondition)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = p_Var1->client_data;
  }
  return pvVar2;
}

Assistant:

extern void *
INT_CMCondition_get_client_data(CManager cm, int condition)
{
    CMCondition cond;
    void *client_data;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (cond) {
	client_data = cond->client_data;
	return client_data;
    } else {
	return NULL;
    }
}